

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

void __thiscall
libcellml::Validator::ValidatorImpl::validateVariableInterface
          (ValidatorImpl *this,VariablePtr *variable,VariableMap *alreadyReported)

{
  value_type *__x;
  IssueImpl *pIVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  element_type *peVar6;
  element_type *peVar7;
  ulong uVar8;
  pointer ppVar9;
  _Rb_tree_const_iterator<std::pair<const_libcellml::Variable::InterfaceType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_530;
  string local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  _Rb_tree_const_iterator<std::pair<const_libcellml::Variable::InterfaceType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_408;
  string local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  undefined1 local_320 [8];
  IssuePtr err_1;
  string interfaceTypeString;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_130 [8];
  IssuePtr err;
  string equivalentComponentName;
  VariablePairPtr pair;
  anon_class_32_2_f86da958_for__M_pred local_e8;
  __normal_iterator<std::shared_ptr<libcellml::VariablePair>_*,_std::vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>_>
  local_c8;
  __normal_iterator<std::shared_ptr<libcellml::VariablePair>_*,_std::vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>_>
  local_c0;
  __normal_iterator<std::shared_ptr<libcellml::VariablePair>_*,_std::vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>_>
  local_b8;
  __normal_iterator<std::shared_ptr<libcellml::VariablePair>_*,_std::vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>_>
  it;
  undefined1 local_a0 [8];
  ComponentPtr equivalentComponent;
  VariablePtr equivalentVariable;
  size_t index;
  string componentName;
  shared_ptr<const_libcellml::ParentedEntity> local_48;
  undefined1 local_38 [8];
  ComponentPtr component;
  InterfaceType interfaceType;
  VariableMap *alreadyReported_local;
  VariablePtr *variable_local;
  ValidatorImpl *this_local;
  
  component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = determineInterfaceType(variable);
  std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Variable,void>
            ((shared_ptr<libcellml::ParentedEntity_const> *)&local_48,variable);
  owningComponent((libcellml *)local_38,(ParentedEntityConstPtr *)&local_48);
  std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_48);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_38);
  NamedEntity::name_abi_cxx11_((string *)&index,(NamedEntity *)peVar3);
  if (component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ == NONE) {
    equivalentVariable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    while( true ) {
      peVar4 = std::
               __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)variable);
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               Variable::equivalentVariableCount(peVar4);
      if (p_Var5 <= equivalentVariable.
                    super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi) break;
      peVar4 = std::
               __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)variable);
      Variable::equivalentVariable
                ((Variable *)
                 &equivalentComponent.
                  super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (size_t)peVar4);
      std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Variable,void>
                ((shared_ptr<libcellml::ParentedEntity_const> *)&it,
                 (shared_ptr<libcellml::Variable> *)
                 &equivalentComponent.
                  super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      owningComponent((libcellml *)local_a0,(ParentedEntityConstPtr *)&it);
      std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr
                ((shared_ptr<const_libcellml::ParentedEntity> *)&it);
      bVar2 = std::operator!=((shared_ptr<libcellml::Component> *)local_a0,(nullptr_t)0x0);
      if ((bVar2) &&
         (bVar2 = reachableEquivalence
                            (variable,(VariablePtr *)
                                      &equivalentComponent.
                                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount), !bVar2)) {
        local_c0._M_current =
             (shared_ptr<libcellml::VariablePair> *)
             std::
             vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
             ::begin(alreadyReported);
        local_c8._M_current =
             (shared_ptr<libcellml::VariablePair> *)
             std::
             vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
             ::end(alreadyReported);
        std::shared_ptr<libcellml::Variable>::shared_ptr
                  (&local_e8.equivalentVariable,
                   (shared_ptr<libcellml::Variable> *)
                   &equivalentComponent.
                    super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  );
        std::shared_ptr<libcellml::Variable>::shared_ptr(&local_e8.variable,variable);
        local_b8 = std::
                   find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<libcellml::VariablePair>*,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>>,libcellml::Validator::ValidatorImpl::validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                             (local_c0,local_c8,&local_e8);
        validateVariableInterface(std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)
        ::$_0::~__0((__0 *)&local_e8);
        pair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                std::
                vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
                ::end(alreadyReported);
        bVar2 = __gnu_cxx::operator==
                          (&local_b8,
                           (__normal_iterator<std::shared_ptr<libcellml::VariablePair>_*,_std::vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>_>
                            *)&pair.
                               super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount);
        if (bVar2) {
          __x = (value_type *)((long)&equivalentComponentName.field_2 + 8);
          VariablePair::create
                    ((VariablePair *)__x,variable,
                     (VariablePtr *)
                     &equivalentComponent.
                      super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::
          vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
          ::push_back(alreadyReported,__x);
          peVar3 = std::
                   __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_a0);
          NamedEntity::name_abi_cxx11_
                    ((string *)
                     &err.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(NamedEntity *)peVar3);
          Issue::IssueImpl::create();
          peVar6 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_130);
          pIVar1 = peVar6->mPimpl;
          peVar4 = std::
                   __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)variable);
          NamedEntity::name_abi_cxx11_(&local_2d0,&peVar4->super_NamedEntity);
          std::operator+(&local_2b0,"The equivalence between \'",&local_2d0);
          std::operator+(&local_290,&local_2b0,"\' in component \'");
          std::operator+(&local_270,&local_290,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index
                        );
          std::operator+(&local_250,&local_270,"\'  and \'");
          peVar4 = std::
                   __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&equivalentComponent.
                                    super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
          NamedEntity::name_abi_cxx11_
                    ((string *)((long)&interfaceTypeString.field_2 + 8),&peVar4->super_NamedEntity);
          std::operator+(&local_230,&local_250,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&interfaceTypeString.field_2 + 8));
          std::operator+(&local_210,&local_230,"\' in component \'");
          std::operator+(&local_1f0,&local_210,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &err.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
          std::operator+(&local_1d0,&local_1f0,"\' is invalid. Component \'");
          std::operator+(&local_1b0,&local_1d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index
                        );
          std::operator+(&local_190,&local_1b0,"\' and \'");
          std::operator+(&local_170,&local_190,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &err.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
          std::operator+(&local_150,&local_170,
                         "\' are neither siblings nor in a parent/child relationship.");
          Issue::IssueImpl::setDescription(pIVar1,&local_150);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_210);
          std::__cxx11::string::~string((string *)&local_230);
          std::__cxx11::string::~string((string *)(interfaceTypeString.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&local_250);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::~string((string *)&local_290);
          std::__cxx11::string::~string((string *)&local_2b0);
          std::__cxx11::string::~string((string *)&local_2d0);
          peVar6 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_130);
          peVar7 = std::
                   __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar6->mPimpl->mItem);
          AnyCellmlElement::AnyCellmlElementImpl::setMapVariables
                    (peVar7->mPimpl,variable,
                     (VariablePtr *)
                     &equivalentComponent.
                      super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          peVar6 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_130);
          Issue::IssueImpl::setReferenceRule(peVar6->mPimpl,MAP_VARIABLES_ELEMENT);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_130);
          std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_130);
          std::__cxx11::string::~string
                    ((string *)
                     &err.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::shared_ptr<libcellml::VariablePair>::~shared_ptr
                    ((shared_ptr<libcellml::VariablePair> *)
                     ((long)&equivalentComponentName.field_2 + 8));
        }
      }
      std::shared_ptr<libcellml::Component>::~shared_ptr
                ((shared_ptr<libcellml::Component> *)local_a0);
      std::shared_ptr<libcellml::Variable>::~shared_ptr
                ((shared_ptr<libcellml::Variable> *)
                 &equivalentComponent.
                  super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      equivalentVariable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(equivalentVariable.
                    super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi)->_vptr__Sp_counted_base + 1);
    }
  }
  else {
    peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)variable);
    Variable::interfaceType_abi_cxx11_
              ((string *)
               &err_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               peVar4);
    bVar2 = interfaceTypeIsCompatible
                      (component.
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._4_4_,
                       (string *)
                       &err_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    if (!bVar2) {
      Issue::IssueImpl::create();
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        peVar6 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_320);
        pIVar1 = peVar6->mPimpl;
        peVar4 = std::
                 __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)variable);
        NamedEntity::name_abi_cxx11_(&local_528,&peVar4->super_NamedEntity);
        std::operator+(&local_508,"Variable \'",&local_528);
        std::operator+(&local_4e8,&local_508,"\' in component \'");
        std::operator+(&local_4c8,&local_4e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index);
        std::operator+(&local_4a8,&local_4c8,"\' has an interface type set to \'");
        std::operator+(&local_488,&local_4a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &err_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
        std::operator+(&local_468,&local_488,
                       "\' which is not the correct interface type for this variable. The interface type required is \'"
                      );
        local_530._M_node =
             (_Base_ptr)
             std::
             map<libcellml::Variable::InterfaceType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::Variable::InterfaceType>,_std::allocator<std::pair<const_libcellml::Variable::InterfaceType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find((map<libcellml::Variable::InterfaceType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::Variable::InterfaceType>,_std::allocator<std::pair<const_libcellml::Variable::InterfaceType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)libcellml::interfaceTypeToString_abi_cxx11_,
                    (key_type *)
                    ((long)&component.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4));
        ppVar9 = std::
                 _Rb_tree_const_iterator<std::pair<const_libcellml::Variable::InterfaceType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_530);
        std::operator+(&local_448,&local_468,&ppVar9->second);
        std::operator+(&local_428,&local_448,"\'.");
        Issue::IssueImpl::setDescription(pIVar1,&local_428);
        std::__cxx11::string::~string((string *)&local_428);
        std::__cxx11::string::~string((string *)&local_448);
        std::__cxx11::string::~string((string *)&local_468);
        std::__cxx11::string::~string((string *)&local_488);
        std::__cxx11::string::~string((string *)&local_4a8);
        std::__cxx11::string::~string((string *)&local_4c8);
        std::__cxx11::string::~string((string *)&local_4e8);
        std::__cxx11::string::~string((string *)&local_508);
        std::__cxx11::string::~string((string *)&local_528);
      }
      else {
        peVar6 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_320);
        pIVar1 = peVar6->mPimpl;
        peVar4 = std::
                 __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)variable);
        NamedEntity::name_abi_cxx11_(&local_400,&peVar4->super_NamedEntity);
        std::operator+(&local_3e0,"Variable \'",&local_400);
        std::operator+(&local_3c0,&local_3e0,"\' in component \'");
        std::operator+(&local_3a0,&local_3c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index);
        std::operator+(&local_380,&local_3a0,
                       "\' has no interface type set. The interface type required is \'");
        local_408._M_node =
             (_Base_ptr)
             std::
             map<libcellml::Variable::InterfaceType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::Variable::InterfaceType>,_std::allocator<std::pair<const_libcellml::Variable::InterfaceType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find((map<libcellml::Variable::InterfaceType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::Variable::InterfaceType>,_std::allocator<std::pair<const_libcellml::Variable::InterfaceType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)libcellml::interfaceTypeToString_abi_cxx11_,
                    (key_type *)
                    ((long)&component.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4));
        ppVar9 = std::
                 _Rb_tree_const_iterator<std::pair<const_libcellml::Variable::InterfaceType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_408);
        std::operator+(&local_360,&local_380,&ppVar9->second);
        std::operator+(&local_340,&local_360,"\'.");
        Issue::IssueImpl::setDescription(pIVar1,&local_340);
        std::__cxx11::string::~string((string *)&local_340);
        std::__cxx11::string::~string((string *)&local_360);
        std::__cxx11::string::~string((string *)&local_380);
        std::__cxx11::string::~string((string *)&local_3a0);
        std::__cxx11::string::~string((string *)&local_3c0);
        std::__cxx11::string::~string((string *)&local_3e0);
        std::__cxx11::string::~string((string *)&local_400);
      }
      peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_320);
      peVar7 = std::
               __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar6->mPimpl->mItem);
      AnyCellmlElement::AnyCellmlElementImpl::setVariable(peVar7->mPimpl,variable);
      peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_320);
      Issue::IssueImpl::setReferenceRule(peVar6->mPimpl,MAP_VARIABLES_ELEMENT);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_320);
      std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_320);
    }
    std::__cxx11::string::~string
              ((string *)
               &err_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__cxx11::string::~string((string *)&index);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_38);
  return;
}

Assistant:

void Validator::ValidatorImpl::validateVariableInterface(const VariablePtr &variable, VariableMap &alreadyReported)
{
    Variable::InterfaceType interfaceType = determineInterfaceType(variable);
    auto component = owningComponent(variable);
    std::string componentName = component->name();
    if (interfaceType == Variable::InterfaceType::NONE) {
        for (size_t index = 0; index < variable->equivalentVariableCount(); ++index) {
            const auto equivalentVariable = variable->equivalentVariable(index);
            auto equivalentComponent = owningComponent(equivalentVariable);
            if (equivalentComponent != nullptr && !reachableEquivalence(variable, equivalentVariable)) {
                auto it = std::find_if(alreadyReported.begin(), alreadyReported.end(),
                                       [equivalentVariable, variable](const VariablePairPtr &in) {
                                           return (in->variable1() == equivalentVariable) && (in->variable2() == variable);
                                       });
                if (it == alreadyReported.end()) {
                    VariablePairPtr pair = VariablePair::create(variable, equivalentVariable);
                    alreadyReported.push_back(pair);
                    std::string equivalentComponentName = equivalentComponent->name();

                    IssuePtr err = Issue::IssueImpl::create();
                    err->mPimpl->setDescription("The equivalence between '" + variable->name() + "' in component '" + componentName + "'  and '" + equivalentVariable->name() + "' in component '" + equivalentComponentName + "' is invalid. Component '" + componentName + "' and '" + equivalentComponentName + "' are neither siblings nor in a parent/child relationship.");
                    err->mPimpl->mItem->mPimpl->setMapVariables(variable, equivalentVariable);
                    err->mPimpl->setReferenceRule(Issue::ReferenceRule::MAP_VARIABLES_ELEMENT);
                    addIssue(err);
                }
            }
        }
    } else {
        auto interfaceTypeString = variable->interfaceType();
        if (!interfaceTypeIsCompatible(interfaceType, interfaceTypeString)) {
            IssuePtr err = Issue::IssueImpl::create();
            if (interfaceTypeString.empty()) {
                err->mPimpl->setDescription("Variable '" + variable->name() + "' in component '" + componentName + "' has no interface type set. The interface type required is '" + interfaceTypeToString.find(interfaceType)->second + "'.");
            } else {
                err->mPimpl->setDescription("Variable '" + variable->name() + "' in component '" + componentName + "' has an interface type set to '" + interfaceTypeString + "' which is not the correct interface type for this variable. The interface type required is '" + interfaceTypeToString.find(interfaceType)->second + "'.");
            }
            err->mPimpl->mItem->mPimpl->setVariable(variable);
            err->mPimpl->setReferenceRule(Issue::ReferenceRule::MAP_VARIABLES_ELEMENT);
            addIssue(err);
        }
    }
}